

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O1

int pzshape::TPZShapeQuad::NConnectShapeF(int side,int order)

{
  long *plVar1;
  int iVar2;
  
  iVar2 = 1;
  if (3 < side) {
    if (side < 8) {
      iVar2 = order + -1;
    }
    else if (side == 8) {
      iVar2 = (order + -1) * (order + -1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"TPZShapeQuad::NConnectShapeF, bad parameter side ",0x31);
      plVar1 = (long *)std::ostream::operator<<(&std::cerr,side);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int TPZShapeQuad::NConnectShapeF(int side, int order) {
		if(side<4) return 1;//0 a 4
		//   int s = side-4;//s = 0 a 14 ou side = 6 a 20
#ifdef PZDEBUG
        {
//            if(order <1) DebugStop();
        }
#endif
		if(side<8) return (order-1);//6 a 14
		if(side==8) {
			return ((order-1)*(order-1));
		}
		PZError << "TPZShapeQuad::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}